

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void luaD_hook(lua_State *L,int event,int line)

{
  int iVar1;
  lua_Hook p_Var2;
  CallInfo *pCVar3;
  StkId pTVar4;
  StkId pTVar5;
  StkId pTVar6;
  int *piVar7;
  StkId pTVar8;
  StkId pTVar9;
  lua_Debug ar;
  lua_Debug local_b0;
  
  p_Var2 = L->hook;
  if ((p_Var2 != (lua_Hook)0x0) && (L->allowhook != '\0')) {
    pCVar3 = L->ci;
    pTVar4 = L->top;
    pTVar5 = L->stack;
    pTVar6 = pCVar3->top;
    local_b0.stacklevel = pCVar3->stacklevel;
    pTVar8 = L->stack_last;
    pTVar9 = pTVar4;
    local_b0.event = event;
    local_b0.currentline = line;
    local_b0.i_ci = pCVar3;
    if ((long)pTVar8 - (long)pTVar4 < 0x150) {
      luaD_growstack(L,0x14);
      pTVar9 = L->top;
      pTVar8 = L->stack_last;
    }
    pCVar3->top = pTVar9 + 0x14;
    if (pTVar8 < pTVar9 + 0x14) {
      __assert_fail("ci->top <= L->stack_last",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x119,"void luaD_hook(lua_State *, int, int)");
    }
    L->allowhook = '\0';
    *(byte *)&pCVar3->callstatus = (byte)pCVar3->callstatus | 4;
    piVar7 = *(int **)&L[-1].hookmask;
    *piVar7 = *piVar7 + -1;
    if (*piVar7 != 0) {
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x11c,"void luaD_hook(lua_State *, int, int)");
    }
    (*p_Var2)(L,&local_b0);
    iVar1 = **(int **)&L[-1].hookmask;
    **(int **)&L[-1].hookmask = iVar1 + 1;
    if (iVar1 != 0) {
      __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x11e,"void luaD_hook(lua_State *, int, int)");
    }
    if (L->allowhook != '\0') {
      __assert_fail("!L->allowhook",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x11f,"void luaD_hook(lua_State *, int, int)");
    }
    L->allowhook = '\x01';
    pTVar8 = L->stack;
    pCVar3->top = (StkId)(((long)pTVar6 - (long)pTVar5) + (long)pTVar8);
    L->top = (StkId)(((long)pTVar4 - (long)pTVar5) + (long)pTVar8);
    *(byte *)&pCVar3->callstatus = (byte)pCVar3->callstatus & 0xfb;
  }
  return;
}

Assistant:

void luaD_hook (lua_State *L, int event, int line) {
  lua_Hook hook = L->hook;
  if (hook && L->allowhook) {  /* make sure there is a hook */
    CallInfo *ci = L->ci;
    ptrdiff_t top = savestack(L, L->top);
    ptrdiff_t ci_top = savestack(L, ci->top);
    lua_Debug ar;
    ar.event = event;
    ar.currentline = line;
    ar.i_ci = ci;
    ar.stacklevel = ci->stacklevel; /* To help Ravi Debugger determine the stack level */
    luaD_checkstack(L, LUA_MINSTACK);  /* ensure minimum stack size */
    ci->top = L->top + LUA_MINSTACK;
    lua_assert(ci->top <= L->stack_last);
    L->allowhook = 0;  /* cannot call hooks inside a hook */
    ci->callstatus |= CIST_HOOKED;
    lua_unlock(L);
    (*hook)(L, &ar);
    lua_lock(L);
    lua_assert(!L->allowhook);
    L->allowhook = 1;
    ci->top = restorestack(L, ci_top);
    L->top = restorestack(L, top);
    ci->callstatus &= ~CIST_HOOKED;
  }
}